

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

LightSamplerHandle
pbrt::LightSamplerHandle::Create(string *name,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  bool bVar1;
  polymorphic_allocator<std::byte> *this;
  char *in_RCX;
  char **in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ExhaustiveLightSampler *in_stack_ffffffffffffffb8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  args;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffd0;
  
  args.bits = (uintptr_t)in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::UniformLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (in_stack_ffffffffffffffd0,(span<const_pbrt::LightHandle> *)args.bits,
               (polymorphic_allocator<std::byte> *)in_RDI);
    TaggedPointer<pbrt::UniformLightSampler>
              ((LightSamplerHandle *)in_RDI,(UniformLightSampler *)in_stack_ffffffffffffffb8);
  }
  else {
    bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::PowerLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                (in_stack_ffffffffffffffd0,(span<const_pbrt::LightHandle> *)args.bits,
                 (polymorphic_allocator<std::byte> *)in_RDI);
      TaggedPointer<pbrt::PowerLightSampler>
                ((LightSamplerHandle *)in_RDI,(PowerLightSampler *)in_stack_ffffffffffffffb8);
    }
    else {
      bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffb8);
      if (bVar1) {
        pstd::pmr::polymorphic_allocator<std::byte>::
        new_object<pbrt::BVHLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                  (in_stack_ffffffffffffffd0,(span<const_pbrt::LightHandle> *)args.bits,
                   (polymorphic_allocator<std::byte> *)in_RDI);
        TaggedPointer<pbrt::BVHLightSampler>
                  ((LightSamplerHandle *)in_RDI,(BVHLightSampler *)in_stack_ffffffffffffffb8);
      }
      else {
        bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffb8);
        if (bVar1) {
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::ExhaustiveLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                    (in_stack_ffffffffffffffd0,(span<const_pbrt::LightHandle> *)args.bits,
                     (polymorphic_allocator<std::byte> *)in_RDI);
          TaggedPointer<pbrt::ExhaustiveLightSampler>
                    ((LightSamplerHandle *)in_RDI,in_stack_ffffffffffffffb8);
        }
        else {
          this = (polymorphic_allocator<std::byte> *)std::__cxx11::string::c_str();
          Error<char_const*>(in_RCX,in_RDX);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::BVHLightSampler,pstd::span<pbrt::LightHandle_const>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                    (this,(span<const_pbrt::LightHandle> *)args.bits,
                     (polymorphic_allocator<std::byte> *)in_RDI);
          TaggedPointer<pbrt::BVHLightSampler>
                    ((LightSamplerHandle *)in_RDI,(BVHLightSampler *)in_stack_ffffffffffffffb8);
        }
      }
    }
  }
  return (LightSamplerHandle)
         (TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          )args.bits;
}

Assistant:

LightSamplerHandle LightSamplerHandle::Create(const std::string &name,
                                              pstd::span<const LightHandle> lights,
                                              Allocator alloc) {
    if (name == "uniform")
        return alloc.new_object<UniformLightSampler>(lights, alloc);
    else if (name == "power")
        return alloc.new_object<PowerLightSampler>(lights, alloc);
    else if (name == "bvh")
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    else if (name == "exhaustive")
        return alloc.new_object<ExhaustiveLightSampler>(lights, alloc);
    else {
        Error(R"(Light sample distribution type "%s" unknown. Using "bvh".)",
              name.c_str());
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    }
}